

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysex.c
# Opt level: O2

void send_multiple_test(void)

{
  int j;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  int count;
  PortMidiStream *midi_out;
  uchar msg [1024];
  
  Pt_Start(1,(PtCallback *)0x0,(void *)0x0);
  puts("This is for performance testing. You should be sending to this");
  puts("program running the receive multiple test. Do NOT send to");
  puts("a synthesizer or you risk reprogramming it");
  iVar1 = get_number("Type output device number: ");
  do {
    latency = get_number(
                        "Latency in milliseconds (0 to send data immediatedly,\n  >0 to send timestamped messages): "
                        );
  } while (latency < 0);
  Pm_OpenOutput(&midi_out,iVar1,(void *)0x0,0,(PmTimeProcPtr)0x0,(void *)0x0,latency);
  do {
    iVar1 = get_number("Message length (7 - 1024): ");
  } while (iVar1 - 0x401U < 0xfffffc06);
  do {
    uVar2 = get_number("Number of messages: ");
  } while ((int)uVar2 < 1);
  msg[0] = 0xf0;
  for (uVar3 = 6; iVar1 - 1U != uVar3; uVar3 = uVar3 + 1) {
    msg[uVar3] = (byte)uVar3 & 0x7f;
  }
  msg[(int)(iVar1 - 1U)] = 0xf7;
  Pt_Time();
  for (; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
    uVar3 = (ulong)uVar2;
    for (lVar4 = 1; lVar4 != 6; lVar4 = lVar4 + 1) {
      msg[lVar4] = (byte)uVar3 & 0x7f;
      uVar3 = uVar3 >> 7;
    }
    Pm_WriteSysEx(midi_out,0,msg);
  }
  Pt_Time();
  Pm_Close(midi_out);
  return;
}

Assistant:

void send_multiple_test()
{
    int outp;
    int length;
    int num_msgs;
    PmStream *midi_out;
    unsigned char msg[1024];
    int i;
    PtTimestamp start_time;
    PtTimestamp stop_time;

    Pt_Start(1, 0, 0);
    
    printf("This is for performance testing. You should be sending to this\n");
    printf("program running the receive multiple test. Do NOT send to\n");
    printf("a synthesizer or you risk reprogramming it\n");
    outp = get_number("Type output device number: ");
    while ((latency = get_number(
                     "Latency in milliseconds (0 to send data immediatedly,\n"
                     "  >0 to send timestamped messages): ")) < 0);
    Pm_OpenOutput(&midi_out, outp, NULL, 0, NULL, NULL, latency);
    while ((length = get_number("Message length (7 - 1024): ")) < 7 ||
           length > 1024) ;
    while ((num_msgs = get_number("Number of messages: ")) < 1);
    /* latency, length, and num_msgs should now all be valid */
    /* compose the message except for sequence number in first 5 bytes */
    msg[0] = (char) MIDI_SYSEX;
    for (i = 6; i < length - 1; i++) {
        msg[i] = i % 128; /* this is just filler */
    }
    msg[length - 1] = (char) MIDI_EOX;

    start_time = Pt_Time();
    /* send the messages */
    for (i = num_msgs; i > 0; i--) {
        /* insert sequence number into first 5 data bytes */
        /* sequence counts down to zero */
        int j;
        int count = i;
        /* 7 bits of message count i goes into each data byte */
        for (j = 1; j <= 5; j++) {
            msg[j] = count & 127;
            count >>= 7;
        }
        /* send the message */
        Pm_WriteSysEx(midi_out, 0, msg);
    }
    stop_time = Pt_Time();
    Pm_Close(midi_out);
    return;
}